

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# battlesystem.cpp
# Opt level: O2

int battle(warrior *Warrior,zombie *Zombie)

{
  bool bVar1;
  int damage;
  int iVar2;
  warriorTypes wVar3;
  undefined8 in_RAX;
  ostream *poVar4;
  char *pcVar5;
  undefined8 uStack_38;
  char selection;
  
  uStack_38 = in_RAX;
  printMessage();
  iVar2 = 1;
  while( true ) {
    bVar1 = warrior::isAlive(Warrior);
    if (!bVar1) break;
    bVar1 = zombie::isKO(Zombie);
    if (bVar1) break;
    (**Warrior->_vptr_warrior)(Warrior);
    zombie::printInfo(Zombie,1);
    (*Warrior->_vptr_warrior[1])(Warrior);
    std::operator>>((istream *)&std::cin,&selection);
    playerAttack(selection,Warrior,Zombie);
    bVar1 = zombie::isKO(Zombie);
    if (bVar1) break;
    zombie::printInfo(Zombie,2);
    damage = zombie::getDmg(Zombie);
    warrior::takeDamage(Warrior,damage);
  }
  bVar1 = zombie::isKO(Zombie);
  if (bVar1) {
    zombie::printInfo(Zombie,3);
    (*Warrior->_vptr_warrior[4])(Warrior,Zombie);
    poVar4 = std::operator<<((ostream *)&std::cout,"Score: ");
    iVar2 = warrior::getScore(Warrior);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,iVar2);
    std::operator<<(poVar4,"\n");
    iVar2 = 0;
  }
  else {
    warrior::isAlive(Warrior);
    wVar3 = warrior::getWarriorType(Warrior);
    pcVar5 = "Derek ";
    if (wVar3 == CHICHONNE) {
      pcVar5 = "Chichonne ";
    }
    std::operator<<((ostream *)&std::cout,pcVar5);
    std::operator<<((ostream *)&std::cout,"Has Been Defeated!\n");
  }
  return iVar2;
}

Assistant:

int battle(warrior *Warrior, zombie *Zombie) {
    //function to perform the battle gameplay
    //returns 0 if player wins
    //returns 1 if zombie wins

    char selection;
    printMessage();
    while (Warrior->isAlive() && !Zombie->isKO()) {
        Warrior->verbosePrint();
        Zombie->printInfo(1);
        Warrior->printOptions();
        cin >> selection;
        playerAttack(selection, Warrior, Zombie);
        if (Zombie->isKO())
            break;
        Zombie->printInfo(2);
        Warrior->takeDamage(Zombie->getDmg());
    }
    if (Zombie->isKO()) {
        Zombie->printInfo(3);
        Warrior->addKill(Zombie);
        cout << "Score: " << Warrior->getScore() << "\n";
        return 0;
    }
    if (!Warrior->isAlive()) {
        (Warrior->getWarriorType() == CHICHONNE) ? cout << "Chichonne " : cout << "Derek ";
        cout << "Has Been Defeated!\n";
        return 1;
    }
}